

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp_client.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  typed_value<unsigned_short,_char> *ptVar1;
  char *pcVar2;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar3;
  size_type sVar4;
  ostream *poVar5;
  time_t tVar6;
  any *paVar7;
  unsigned_short *puVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *host;
  io_service io_service;
  _Any_data local_448;
  code *local_438;
  code *local_430;
  thread worker;
  vector<unsigned_char,_std::allocator<unsigned_char>_> received;
  string a;
  sender s;
  string port_name;
  rudp_server server;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_2a8;
  basic_resolver_entry<boost::asio::ip::udp> remote_endpoint;
  query query;
  resolver resolver;
  variables_map values;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_158 [144];
  options_description opts;
  undefined8 local_48 [2];
  undefined8 uStack_34;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&server,"Options",(allocator<char> *)&values);
  boost::program_options::options_description::options_description
            (&opts,(string *)&server,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)&server);
  _values = boost::program_options::options_description::add_options();
  ptVar1 = boost::program_options::value<unsigned_short>();
  query.hints_.ai_flags._0_2_ = 8000;
  ptVar1 = boost::program_options::typed_value<unsigned_short,_char>::default_value
                     (ptVar1,(unsigned_short *)&query);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&values,(value_semantic *)"remote_port,r",(char *)ptVar1);
  ptVar1 = boost::program_options::value<unsigned_short>();
  remote_endpoint.endpoint_.impl_.data_.base.sa_family = 0x1f41;
  ptVar1 = boost::program_options::typed_value<unsigned_short,_char>::default_value
                     (ptVar1,(unsigned_short *)&remote_endpoint);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"self_port,s",(char *)ptVar1);
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&server,"localhost",(allocator<char> *)&resolver);
  ptVar3 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&server);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"host,H",(char *)ptVar3);
  boost::program_options::options_description_easy_init::operator()(pcVar2,"help,h");
  std::__cxx11::string::~string((string *)&server);
  boost::program_options::variables_map::variables_map(&values);
  local_2a8.super_function_base.vtable = (vtable_base *)0x0;
  local_2a8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_2a8.super_function_base.functor._8_8_ = 0;
  local_2a8.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)&server,argc,argv,&opts,0,&local_2a8);
  boost::program_options::store((basic_parsed_options *)&server,&values,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&server);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_2a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&server,"help",(allocator<char> *)&query);
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_158,(key_type *)&server);
  std::__cxx11::string::~string((string *)&server);
  if (sVar4 == 0) {
    tVar6 = time((time_t *)0x0);
    srand((uint)tVar6);
    boost::asio::io_context::io_context(&io_service);
    boost::asio::detail::
    io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::io_object_impl<boost::asio::io_context>(&resolver.impl_,&io_service,(type *)0x0);
    port_name._M_dataplus._M_p = (pointer)&port_name.field_2;
    port_name._M_string_length = 0;
    port_name.field_2._M_local_buf[0] = '\0';
    query.hints_._0_8_ = &port_name;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&server,"remote_port",(allocator<char> *)&remote_endpoint);
    paVar7 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&values);
    puVar8 = boost::any_cast<unsigned_short_const&>(paVar7);
    boost::spirit::karma::
    generate<std::back_insert_iterator<std::__cxx11::string>,boost::spirit::terminal<boost::spirit::tag::ushort_>,unsigned_short>
              ((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&query,(terminal<boost::spirit::tag::ushort_> *)&boost::spirit::ushort_,puVar8);
    std::__cxx11::string::~string((string *)&server);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&server,"host",(allocator<char> *)&remote_endpoint);
    paVar7 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&values);
    host = boost::any_cast<std::__cxx11::string_const&>(paVar7);
    boost::asio::ip::basic_resolver_query<boost::asio::ip::udp>::basic_resolver_query
              (&query,host,&port_name,address_configured);
    std::__cxx11::string::~string((string *)&server);
    boost::asio::ip::
    basic_resolver<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::resolve((results_type *)&server,&resolver,&query);
    boost::asio::ip::basic_resolver_entry<boost::asio::ip::udp>::basic_resolver_entry
              (&remote_endpoint,
               (basic_resolver_entry<boost::asio::ip::udp> *)
               ((long)server.socket.
                      super_basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                      .impl_.service_ * 0x60 +
               (long)((server.io_service)->super_execution_context).service_registry_));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&server.port);
    received.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    received.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    received.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&s,"self_port",(allocator<char> *)local_448._M_pod_data);
    paVar7 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&values);
    puVar8 = boost::any_cast<unsigned_short_const&>(paVar7);
    a._M_string_length = 0;
    a._M_dataplus._M_p = (pointer)&received;
    a.field_2._8_8_ =
         std::
         _Function_handler<void_(rudp::rudp_server_&,_unsigned_int,_const_std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Fadis[P]rudp/src/rudp_client.cpp:84:5)>
         ::_M_invoke;
    a.field_2._M_allocated_capacity =
         (size_type)
         std::
         _Function_handler<void_(rudp::rudp_server_&,_unsigned_int,_const_std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Fadis[P]rudp/src/rudp_client.cpp:84:5)>
         ::_M_manager;
    rudp::rudp_server::rudp_server
              (&server,&io_service,*puVar8,
               (function<void_(rudp::rudp_server_&,_unsigned_int,_const_std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>_&)>
                *)&a);
    std::_Function_base::~_Function_base((_Function_base *)&a);
    std::__cxx11::string::~string((string *)&s);
    sender::sender(&s,&server);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&a,"abcde",(allocator<char> *)local_448._M_pod_data);
    local_48[0] = CONCAT62(remote_endpoint.endpoint_.impl_.data_._2_6_,
                           remote_endpoint.endpoint_.impl_.data_.base.sa_family);
    uStack_34 = remote_endpoint.endpoint_.impl_.data_._20_8_;
    local_448._8_8_ = 0;
    local_430 = std::
                _Function_handler<void_(bool,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Fadis[P]rudp/src/rudp_client.cpp:94:36)>
                ::_M_invoke;
    local_438 = std::
                _Function_handler<void_(bool,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Fadis[P]rudp/src/rudp_client.cpp:94:36)>
                ::_M_manager;
    local_448._M_unused._M_object = &s;
    worker._M_id._M_thread = (id)(id)&s;
    rudp::rudp_server::connect(&server,(int)local_48,(sockaddr *)&local_448,(socklen_t)&worker);
    std::_Function_base::~_Function_base((_Function_base *)&worker);
    std::_Function_base::~_Function_base((_Function_base *)&local_448);
    worker._M_id._M_thread = (id)0;
    local_448._M_unused._M_object = operator_new(0x10);
    *(undefined ***)local_448._M_unused._0_8_ = &PTR___State_00165b00;
    *(io_service **)((long)local_448._M_unused._0_8_ + 8) = &io_service;
    std::thread::_M_start_thread(&worker,&local_448,0);
    if ((long *)local_448._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_448._M_unused._M_object + 8))();
    }
    std::thread::join();
    std::thread::~thread(&worker);
    std::__cxx11::string::~string((string *)&a);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&s.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    rudp::rudp_server::~rudp_server(&server);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&received.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    boost::asio::ip::basic_resolver_entry<boost::asio::ip::udp>::~basic_resolver_entry
              (&remote_endpoint);
    boost::asio::ip::basic_resolver_query<boost::asio::ip::udp>::~basic_resolver_query(&query);
    std::__cxx11::string::~string((string *)&port_name);
    boost::asio::detail::
    io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::~io_object_impl(&resolver.impl_);
    boost::asio::execution_context::~execution_context(&io_service.super_execution_context);
  }
  else {
    poVar5 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,&opts);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  boost::program_options::variables_map::~variables_map(&values);
  boost::program_options::options_description::~options_description(&opts);
  return 0;
}

Assistant:

int main( int argc, char *argv[] ) {
  namespace po = boost::program_options;
  po::options_description opts( "Options" );
  opts.add_options()
    ( "remote_port,r", po::value< uint16_t >()->default_value( 8000 ), "port" )
    ( "self_port,s", po::value< uint16_t >()->default_value( 8001 ), "port" )
    ( "host,H", po::value< std::string >()->default_value( "localhost" ), "host" )
    ( "help,h", "display this message" );
  po::variables_map values;
  po::store( po::parse_command_line( argc, argv, opts ), values );
  if( values.count("help") ) {
    std::cout << opts << std::endl;
    return 0;
  }
  srand( time( nullptr ) );
  boost::asio::io_service io_service;
  using boost::asio::ip::udp;
  udp::resolver resolver( io_service );
  std::string port_name;
  boost::spirit::karma::generate( std::back_inserter( port_name ), boost::spirit::karma::ushort_, values[ "remote_port" ].as< uint16_t >() );
  udp::resolver::query query( values[ "host" ].as< std::string >(), port_name );
  const auto remote_endpoint = *resolver.resolve( query );
  std::vector< uint8_t > received;
  rudp::rudp_server server( io_service, values[ "self_port" ].as< uint16_t >(),
    [&]( rudp::rudp_server&, uint32_t ident, const rudp::buffers_ptr_t &bufs ) {
      std::cout << "received" << std::endl;
      for( const auto &buf: *bufs ) {
        const auto header_size = (*buf)[ 1 ];
        received.insert( received.end(), std::next( buf->begin(), header_size ), buf->end() );
      }
    }
  );
  sender s( server );
  std::string a( "abcde" );
  server.connect( remote_endpoint, [&]( bool status, uint32_t identifier ) {
    if( status ) {
      std::cout << "connected" << std::endl;
      s( identifier );
    }
    else std::cout << "failed" << std::endl;
  },
  [&]() {
    std::cout << "closed" << std::endl;
    s.check( received );
  } );
  std::thread worker( [&]() { io_service.run(); } );
  worker.join();
}